

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

LRUHandle ** __thiscall
leveldb::anon_unknown_0::HandleTable::FindPointer(HandleTable *this,Slice *key,uint32_t hash)

{
  Slice *x;
  bool local_3a;
  bool local_39;
  Slice local_38;
  LRUHandle **local_28;
  LRUHandle **ptr;
  Slice *pSStack_18;
  uint32_t hash_local;
  Slice *key_local;
  HandleTable *this_local;
  
  local_28 = this->list_ + (hash & this->length_ - 1);
  ptr._4_4_ = hash;
  pSStack_18 = key;
  key_local = (Slice *)this;
  while( true ) {
    x = pSStack_18;
    local_39 = false;
    if (*local_28 != (LRUHandle *)0x0) {
      local_3a = true;
      if ((*local_28)->hash == ptr._4_4_) {
        local_38 = LRUHandle::key(*local_28);
        local_3a = operator!=(x,&local_38);
      }
      local_39 = local_3a;
    }
    if (local_39 == false) break;
    local_28 = &(*local_28)->next_hash;
  }
  return local_28;
}

Assistant:

LRUHandle** FindPointer(const Slice& key, uint32_t hash) {
    LRUHandle** ptr = &list_[hash & (length_ - 1)];
    while (*ptr != nullptr && ((*ptr)->hash != hash || key != (*ptr)->key())) {
      ptr = &(*ptr)->next_hash;
    }
    return ptr;
  }